

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

bool __thiscall
glcts::TestCaseBase::buildProgramVA
          (TestCaseBase *this,GLuint po_id,bool *out_has_compilation_failed,uint sh_stages,...)

{
  ostringstream *poVar1;
  uint uVar2;
  char in_AL;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  uint parts;
  GLenum shader_type_00;
  GLenum shader_type_01;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  pointer puVar8;
  bool bVar9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  GLuint sh_id;
  GLint compilation_status;
  GLint shader_type;
  va_list values;
  GLint link_status;
  bool *local_2f0;
  string sh_merged_string;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_sh_id;
  string shader_type_str;
  string info_log;
  undefined1 local_268 [384];
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  long lVar5;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_2f0 = out_has_compilation_failed;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values[0].overflow_arg_area = &stack0x00000008;
  compilation_status = 0;
  values[0].gp_offset = 0x20;
  values[0].fp_offset = 0x30;
  values[0].reg_save_area = local_e8;
  do {
    do {
      bVar9 = sh_stages == 0;
      sh_stages = sh_stages - 1;
      if (bVar9) {
LAB_00cc77ce:
        if (local_2f0 != (bool *)0x0) {
          *local_2f0 = compilation_status == 0;
        }
        if (compilation_status == 1) {
          _link_status = (pointer)((ulong)_link_status & 0xffffffff00000000);
          (**(code **)(lVar5 + 0xce8))(po_id);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glLinkProgram() failed!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                          ,0x1cb);
          (**(code **)(lVar5 + 0x9d8))(po_id,0x8b82,&link_status);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glGetProgramiv() failed!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                          ,0x1ce);
          uVar7 = CONCAT71((int7)((ulong)&sh_merged_string >> 8),link_status == 1);
          if (link_status != 1) {
            getLinkingInfoLog_abi_cxx11_(&sh_merged_string,this,po_id);
            local_268._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_268 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            local_2f0 = (bool *)CONCAT44(local_2f0._4_4_,(int)uVar7);
            std::operator<<((ostream *)poVar1,"Link failure:\n\n");
            std::operator<<((ostream *)poVar1,(string *)&sh_merged_string);
            std::operator<<((ostream *)poVar1,"\n\n");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            poVar1 = (ostringstream *)(local_268 + 8);
            for (puVar8 = vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                puVar8 != vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
              sh_id = 0;
              (**(code **)(lVar5 + 0xa70))(*puVar8,0x8b4f,&sh_id);
              getShaderTypeName_abi_cxx11_(&info_log,(glcts *)(ulong)sh_id,shader_type_01);
              getShaderSource_abi_cxx11_(&shader_type_str,this,*puVar8);
              local_268._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,(string *)&info_log);
              std::operator<<((ostream *)poVar1," source:\n\n");
              std::operator<<((ostream *)poVar1,(string *)&shader_type_str);
              std::operator<<((ostream *)poVar1,"\n\n");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::__cxx11::string::~string((string *)&shader_type_str);
              std::__cxx11::string::~string((string *)&info_log);
            }
            std::__cxx11::string::~string((string *)&sh_merged_string);
            uVar7 = (ulong)local_2f0 & 0xffffffff;
          }
        }
        else {
          uVar7 = 0;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&vec_sh_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        return (bool)(char)uVar7;
      }
      uVar2 = values[0].gp_offset;
      uVar7 = values[0]._0_8_ & 0xffffffff;
      if (uVar7 < 0x29) {
        values[0].gp_offset = values[0].gp_offset + 8;
        sh_id = *(GLuint *)((long)values[0].reg_save_area + uVar7);
        if (0x20 < uVar2) goto LAB_00cc759a;
        values[0].gp_offset = (uint)(uVar7 + 0x10);
        parts = *(uint *)((long)values[0].reg_save_area + uVar7 + 8);
        if (0x18 < uVar2) goto LAB_00cc75aa;
        values[0].gp_offset = uVar2 + 0x18;
        puVar6 = (undefined8 *)(uVar7 + 0x10 + (long)values[0].reg_save_area);
      }
      else {
        sh_id = *values[0].overflow_arg_area;
        values[0].overflow_arg_area = (void *)((long)values[0].overflow_arg_area + 8);
LAB_00cc759a:
        parts = *values[0].overflow_arg_area;
        values[0].overflow_arg_area = (void *)((long)values[0].overflow_arg_area + 8);
LAB_00cc75aa:
        puVar6 = (undefined8 *)values[0].overflow_arg_area;
        values[0].overflow_arg_area = (void *)((long)values[0].overflow_arg_area + 8);
      }
    } while (sh_id == 0);
    if (parts != 0) {
      specializeShader_abi_cxx11_(&sh_merged_string,this,parts,(char **)*puVar6);
      _link_status = sh_merged_string._M_dataplus._M_p;
      (**(code **)(lVar5 + 0x12b8))(sh_id,1,&link_status,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glShaderSource() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                      ,0x19b);
      (**(code **)(lVar5 + 0x248))(sh_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCompileShader() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                      ,0x19e);
      (**(code **)(lVar5 + 0xa70))(sh_id,0x8b81,&compilation_status);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                      ,0x1a1);
      if (compilation_status != 1) {
        shader_type = 0;
        getCompilationInfoLog_abi_cxx11_(&info_log,this,sh_id);
        (**(code **)(lVar5 + 0xa70))(sh_id,0x8b4f,&shader_type);
        poVar1 = (ostringstream *)(local_268 + 8);
        getShaderTypeName_abi_cxx11_
                  (&shader_type_str,(glcts *)(ulong)(uint)shader_type,shader_type_00);
        local_268._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,(string *)&shader_type_str);
        std::operator<<((ostream *)poVar1," compilation failure:\n\n");
        std::operator<<((ostream *)poVar1,(string *)&info_log);
        std::operator<<((ostream *)poVar1,"\n\n");
        std::operator<<((ostream *)poVar1,(string *)&shader_type_str);
        std::operator<<((ostream *)poVar1," source:\n\n");
        std::operator<<((ostream *)poVar1,(string *)&sh_merged_string);
        std::operator<<((ostream *)poVar1,"\n\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::__cxx11::string::~string((string *)&shader_type_str);
        std::__cxx11::string::~string((string *)&info_log);
        std::__cxx11::string::~string((string *)&sh_merged_string);
        goto LAB_00cc77ce;
      }
      std::__cxx11::string::~string((string *)&sh_merged_string);
    }
    (**(code **)(lVar5 + 0x10))(po_id,sh_id);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glAttachShader(VERTEX_SHADER) call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x1b6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&vec_sh_id,&sh_id);
  } while( true );
}

Assistant:

bool TestCaseBase::buildProgramVA(glw::GLuint po_id, bool* out_has_compilation_failed, unsigned int sh_stages, ...)
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	std::vector<glw::GLuint> vec_sh_id;

	va_list values;
	va_start(values, sh_stages);

	/* Shaders compilation */
	glw::GLint compilation_status = GL_FALSE;

	for (unsigned int stage = 0; stage < sh_stages; ++stage)
	{
		glw::GLuint		   sh_id	= va_arg(values, glw::GLuint);
		unsigned int	   sh_parts = va_arg(values, unsigned int);
		const char* const* sh_code  = va_arg(values, const char* const*);

		if (sh_id == 0)
		{
			continue;
		}

		if (sh_parts != 0)
		{
			std::string sh_merged_string = specializeShader(sh_parts, sh_code);
			const char* sh_merged_ptr	= sh_merged_string.c_str();

			gl.shaderSource(sh_id, 1, &sh_merged_ptr, NULL);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed!");

			gl.compileShader(sh_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed!");

			gl.getShaderiv(sh_id, GL_COMPILE_STATUS, &compilation_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed!");

			if (compilation_status != GL_TRUE)
			{
				glw::GLint  shader_type = 0;
				std::string info_log	= getCompilationInfoLog(sh_id);

				gl.getShaderiv(sh_id, GL_SHADER_TYPE, &shader_type);
				std::string shader_type_str = getShaderTypeName(shader_type);

				m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " compilation failure:\n\n"
								   << info_log << "\n\n"
								   << shader_type_str << " source:\n\n"
								   << sh_merged_string << "\n\n"
								   << tcu::TestLog::EndMessage;

				break;
			}
		}

		gl.attachShader(po_id, sh_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader(VERTEX_SHADER) call failed");

		vec_sh_id.push_back(sh_id);
	}

	va_end(values);

	if (out_has_compilation_failed != NULL)
	{
		*out_has_compilation_failed = (compilation_status == GL_FALSE);
	}

	if (compilation_status != GL_TRUE)
	{
		return false;
	}

	/* Linking the program */

	glw::GLint link_status = GL_FALSE;
	gl.linkProgram(po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed!");

	gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed!");

	if (link_status != GL_TRUE)
	{
		/* Dump link log */
		std::string link_log = getLinkingInfoLog(po_id);
		m_testCtx.getLog() << tcu::TestLog::Message << "Link failure:\n\n"
						   << link_log << "\n\n"
						   << tcu::TestLog::EndMessage;

		/* Dump shader source */
		for (std::vector<glw::GLuint>::iterator it = vec_sh_id.begin(); it != vec_sh_id.end(); ++it)
		{
			glw::GLint shader_type = 0;
			gl.getShaderiv(*it, GL_SHADER_TYPE, &shader_type);
			std::string shader_type_str = getShaderTypeName(shader_type);
			std::string shader_source   = getShaderSource(*it);
			m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " source:\n\n"
							   << shader_source << "\n\n"
							   << tcu::TestLog::EndMessage;
		}

		return false;
	}

	return true;
}